

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

void __thiscall
CVmObjStringBuffer::restore_from_file
          (CVmObjStringBuffer *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  int32_t iVar1;
  wchar_t wVar2;
  CVmVarHeap *pCVar3;
  vm_strbuf_ext *pvVar4;
  size_t in_RDI;
  char *src;
  int32_t cur;
  int32_t rem;
  wchar_t *dst;
  vm_strbuf_ext *ext;
  int32_t len;
  int32_t inc;
  int32_t alo;
  char buf [512];
  int32_t bufchars;
  int local_264;
  char *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  wchar_t *local_248;
  int32_t local_234;
  char local_228 [516];
  undefined4 local_24;
  
  local_24 = 0x100;
  if (*(long *)(in_RDI + 8) != 0) {
    pCVar3 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar3->_vptr_CVmVarHeap[6])(pCVar3,*(undefined8 *)(in_RDI + 8));
  }
  CVmFile::read_bytes((CVmFile *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                      in_stack_fffffffffffffda8,in_RDI);
  iVar1 = vmb_get_int4((char *)0x38adb7);
  vmb_get_int4((char *)0x38adc9);
  local_234 = vmb_get_int4((char *)0x38addb);
  pvVar4 = vm_strbuf_ext::alloc_ext
                     ((CVmObjStringBuffer *)
                      CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                      (int32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                      (int32_t)in_stack_fffffffffffffda8);
  *(vm_strbuf_ext **)(in_RDI + 8) = pvVar4;
  if (iVar1 < local_234) {
    local_234 = iVar1;
  }
  pvVar4->len = local_234;
  local_248 = pvVar4->buf;
  while (local_234 != 0) {
    local_264 = local_234;
    if (0x100 < local_234) {
      local_264 = 0x100;
    }
    CVmFile::read_bytes((CVmFile *)CONCAT44(local_234,local_264),in_stack_fffffffffffffda8,in_RDI);
    local_234 = local_234 - local_264;
    in_stack_fffffffffffffda8 = local_228;
    for (; local_264 != 0; local_264 = local_264 + -1) {
      wVar2 = ::osrp2(in_stack_fffffffffffffda8);
      *local_248 = wVar2;
      in_stack_fffffffffffffda8 = in_stack_fffffffffffffda8 + 2;
      local_248 = local_248 + 1;
    }
  }
  return;
}

Assistant:

void CVmObjStringBuffer::restore_from_file(VMG_ vm_obj_id_t self,
                                           CVmFile *fp, CVmObjFixup *fixups)
{
    const int32_t bufchars = 256;
    char buf[bufchars * sizeof(uint16_t)];
    
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the fixed fields */
    fp->read_bytes(buf, 12);
    int32_t alo = vmb_get_int4(buf);
    int32_t inc = vmb_get_int4(buf + 4);
    int32_t len = vmb_get_int4(buf + 8);

    /* allocate the extension structure */
    vm_strbuf_ext *ext = vm_strbuf_ext::alloc_ext(vmg_ this, alo, inc);
    ext_ = (char *)ext;

    /* limit the length */
    if (len > alo)
        len = alo;

    /* store it in the extension */
    ext->len = len;

    /* read the string contents */
    wchar_t *dst;
    int32_t rem;
    for (dst = ext->buf, rem = len ; rem != 0 ; )
    {
        /* read one buffer-full, or 'rem', whichever is less */
        int32_t cur = rem > bufchars ? bufchars : rem;
        fp->read_bytes(buf, cur * sizeof(uint16_t));

        /* deduct this read from the total */
        rem -= cur;

        /* decode the characters */
        for (const char *src = buf ; cur != 0 ;
             *dst++ = osrp2(src), src += 2, --cur) ;
    }
}